

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
trng::utility::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          io_range<const_unsigned_int_*> *IO_range)

{
  uint *puVar1;
  
  puVar1 = IO_range->first;
  while ((((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0 && (puVar1 != IO_range->last)
         )) {
    std::ostream::_M_insert<unsigned_long>((ulong)out);
    puVar1 = puVar1 + 1;
    if ((puVar1 != IO_range->last) && (IO_range->delim_str != (char *)0x0)) {
      std::operator<<(out,IO_range->delim_str);
    }
  }
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                     const io_range<T> &IO_range) {
      T pos{IO_range.first};
      while (out and pos != IO_range.last) {
        out << (*pos);
        ++pos;
        if (pos != IO_range.last and IO_range.delim_str != 0)
          out << IO_range.delim_str;
      }
      return out;
    }